

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_FFDHE.c
# Opt level: O3

void ffdhe_precomp_p(Spec_FFDHE_ffdhe_alg a,uint64_t *p_r2_n)

{
  uint64_t *puVar1;
  long lVar2;
  uint8_t *in_RCX;
  uint8_t *extraout_RDX;
  ulong *extraout_RDX_00;
  uint64_t *b_n;
  ulong *puVar3;
  uint32_t uVar4;
  uint32_t len;
  uint uVar5;
  undefined7 in_register_00000039;
  ulong uVar6;
  size_t __n;
  void *__s;
  uint uVar7;
  uint64_t *res;
  ulong uVar8;
  undefined8 uStack_a0;
  uint64_t *puStack_98;
  code *pcStack_68;
  uint64_t uStack_60;
  uint8_t *puStack_58;
  uint64_t *puStack_50;
  uint8_t *puStack_48;
  ulong uStack_40;
  
  uVar6 = CONCAT71(in_register_00000039,a);
  switch(uVar6 & 0xffffffff) {
  case 0:
    Hacl_Bignum_Convert_bn_from_bytes_be_uint64(0x100,Hacl_Impl_FFDHE_Constants_ffdhe_p2048,p_r2_n);
    uVar4 = 0x7ff;
    len = 0x20;
    lVar2 = 0x1f;
    break;
  case 1:
    Hacl_Bignum_Convert_bn_from_bytes_be_uint64(0x180,Hacl_Impl_FFDHE_Constants_ffdhe_p3072,p_r2_n);
    uVar4 = 0xbff;
    len = 0x30;
    lVar2 = 0x2f;
    break;
  case 2:
    Hacl_Bignum_Convert_bn_from_bytes_be_uint64(0x200,Hacl_Impl_FFDHE_Constants_ffdhe_p4096,p_r2_n);
    uVar4 = 0xfff;
    len = 0x40;
    lVar2 = 0x3f;
    break;
  case 3:
    Hacl_Bignum_Convert_bn_from_bytes_be_uint64(0x300,Hacl_Impl_FFDHE_Constants_ffdhe_p6144,p_r2_n);
    uVar4 = 0x17ff;
    len = 0x60;
    lVar2 = 0x5f;
    break;
  case 4:
    Hacl_Bignum_Convert_bn_from_bytes_be_uint64(0x400,Hacl_Impl_FFDHE_Constants_ffdhe_p8192,p_r2_n);
    uVar4 = 0x1fff;
    len = 0x80;
    lVar2 = 0x7f;
    break;
  default:
    ffdhe_precomp_p_cold_1();
    uVar5 = (uint)uVar6;
    puStack_50 = p_r2_n;
    if (4 < (byte)uVar6) {
      pcStack_68 = Hacl_Bignum_Convert_bn_from_bytes_be_uint64;
      Hacl_FFDHE_ffdhe_secret_to_public_precomp_cold_1();
      uVar7 = uVar5 - 1 & 0xfffffff8;
      uVar8 = (ulong)uVar7;
      uVar6 = (ulong)(uVar7 + 8);
      lVar2 = -(uVar6 + 0xf & 0xfffffffffffffff0);
      __s = (void *)((long)&puStack_98 + lVar2);
      puStack_98 = p_r2_n;
      pcStack_68 = (code *)&stack0xfffffffffffffff0;
      *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x15eb01;
      memset(__s,0,uVar6);
      puVar1 = puStack_98;
      *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x15eb16;
      memcpy((void *)((long)__s + (uVar6 - uVar5)),puVar1,(ulong)uVar5);
      puVar3 = extraout_RDX_00;
      do {
        uVar6 = *(ulong *)((long)__s + (uVar8 & 0xffffffff));
        *puVar3 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 |
                  (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                  (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 | (uVar6 & 0xff00) << 0x28
                  | uVar6 << 0x38;
        uVar8 = uVar8 - 8;
        puVar3 = puVar3 + 1;
      } while (uVar8 != 0xfffffffffffffff8);
      return;
    }
    uStack_40 = uVar6 & 0xff;
    uVar4 = *(uint32_t *)(&DAT_001dbc10 + uStack_40 * 4);
    uVar8 = (ulong)(uVar4 - 1 & 0xfffffff8);
    uVar6 = uVar8 + 0x17 & 0xfffffffffffffff0;
    lVar2 = -uVar6;
    b_n = (uint64_t *)((long)&uStack_60 + lVar2);
    __n = uVar8 + 8;
    puStack_58 = in_RCX;
    puStack_48 = extraout_RDX;
    *(undefined8 *)((long)&pcStack_68 + lVar2) = 0x15ea67;
    memset(b_n,0,__n);
    *b_n = 2;
    res = (uint64_t *)((long)b_n - uVar6);
    res[-1] = 0x15ea84;
    memset(res,0,__n);
    res[-1] = 0x15ea93;
    Hacl_Bignum_Convert_bn_from_bytes_be_uint64(uVar4,puStack_48,res);
    uVar6 = uStack_40;
    puVar1 = puStack_50;
    res[-1] = 0x15eaaa;
    ffdhe_compute_exp((Spec_FFDHE_ffdhe_alg)uVar6,puVar1,res,b_n,puStack_58);
    return;
  }
  Hacl_Bignum_Montgomery_bn_precomp_r2_mod_n_u64(len,uVar4,p_r2_n,p_r2_n + lVar2 + 1);
  return;
}

Assistant:

static inline void ffdhe_precomp_p(Spec_FFDHE_ffdhe_alg a, uint64_t *p_r2_n)
{
  uint32_t nLen = (ffdhe_len(a) - 1U) / 8U + 1U;
  uint64_t *p_n = p_r2_n;
  uint64_t *r2_n = p_r2_n + nLen;
  uint32_t sw;
  switch (a)
  {
    case Spec_FFDHE_FFDHE2048:
      {
        sw = 256U;
        break;
      }
    case Spec_FFDHE_FFDHE3072:
      {
        sw = 384U;
        break;
      }
    case Spec_FFDHE_FFDHE4096:
      {
        sw = 512U;
        break;
      }
    case Spec_FFDHE_FFDHE6144:
      {
        sw = 768U;
        break;
      }
    case Spec_FFDHE_FFDHE8192:
      {
        sw = 1024U;
        break;
      }
    default:
      {
        KRML_HOST_EPRINTF("KaRaMeL incomplete match at %s:%d\n", __FILE__, __LINE__);
        KRML_HOST_EXIT(253U);
      }
  }
  KRML_CHECK_SIZE(sizeof (uint8_t), sw);
  uint8_t p_s[sw];
  memset(p_s, 0U, sw * sizeof (uint8_t));
  const uint8_t *p;
  switch (a)
  {
    case Spec_FFDHE_FFDHE2048:
      {
        p = Hacl_Impl_FFDHE_Constants_ffdhe_p2048;
        break;
      }
    case Spec_FFDHE_FFDHE3072:
      {
        p = Hacl_Impl_FFDHE_Constants_ffdhe_p3072;
        break;
      }
    case Spec_FFDHE_FFDHE4096:
      {
        p = Hacl_Impl_FFDHE_Constants_ffdhe_p4096;
        break;
      }
    case Spec_FFDHE_FFDHE6144:
      {
        p = Hacl_Impl_FFDHE_Constants_ffdhe_p6144;
        break;
      }
    case Spec_FFDHE_FFDHE8192:
      {
        p = Hacl_Impl_FFDHE_Constants_ffdhe_p8192;
        break;
      }
    default:
      {
        KRML_HOST_EPRINTF("KaRaMeL incomplete match at %s:%d\n", __FILE__, __LINE__);
        KRML_HOST_EXIT(253U);
      }
  }
  uint32_t len = ffdhe_len(a);
  for (uint32_t i = 0U; i < len; i++)
  {
    uint8_t *os = p_s;
    uint8_t x = p[i];
    os[i] = x;
  }
  Hacl_Bignum_Convert_bn_from_bytes_be_uint64(ffdhe_len(a), p_s, p_n);
  Hacl_Bignum_Montgomery_bn_precomp_r2_mod_n_u64((ffdhe_len(a) - 1U) / 8U + 1U,
    8U * ffdhe_len(a) - 1U,
    p_n,
    r2_n);
}